

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildCall(CNscPStackEntry *pFn,CNscPStackEntry *pArgList)

{
  bool bVar1;
  NscType NVar2;
  CNscContext *this;
  NscSymbol *pSymbol_00;
  char *pcVar3;
  int *piVar4;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  NscPCodeDeclaration *p2_1;
  NscPCodeCall *pc;
  bool fIsBad;
  NscPCodeDeclaration *p2;
  NscPCodeArgument *p1;
  int nFnArgCount;
  NscSymbolFunctionExtra *pfnExtra;
  uchar *pauchFnData;
  int nArgCount;
  uchar *pauchEnd;
  uchar *pauchData;
  size_t nDataSize;
  uchar *pauchStartData;
  NscSymbol *pSymbol;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffff18;
  NscType in_stack_ffffffffffffff1c;
  CNscContext *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff38;
  uchar *in_stack_ffffffffffffff40;
  CNscContext *pCVar5;
  CNscContext *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar6;
  undefined8 in_stack_ffffffffffffff58;
  NscType nType;
  CNscPStackEntry *in_stack_ffffffffffffff60;
  bool local_79;
  int local_64;
  long *local_58;
  uint local_4c;
  long *local_40;
  size_t local_38;
  long *local_30;
  
  nType = (NscType)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  this = (CNscContext *)
         CNscContext::GetPStackEntry
                   (in_stack_ffffffffffffff20,
                    (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    if (in_RDI == (CNscPStackEntry *)0x0) {
      __assert_fail("pFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x11d2,"CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
    }
    CNscPStackEntry::GetIdentifier(in_RDI);
    pSymbol_00 = CNscContext::FindDeclSymbol
                           (in_stack_ffffffffffffff20,
                            (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (pSymbol_00 == (NscSymbol *)0x0) {
      pCVar5 = g_pCtx;
      pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
      CNscContext::GenerateMessage(pCVar5,NscMessage_ErrorUndeclaredIdentifier,pcVar3);
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    else if (pSymbol_00->nSymType == NscSymType_Function) {
      local_30 = (long *)0x0;
      local_38 = 0;
      if (in_RSI != (CNscPStackEntry *)0x0) {
        local_30 = (long *)CNscPStackEntry::GetData(in_RSI);
        local_38 = CNscPStackEntry::GetDataSize(in_RSI);
      }
      local_40 = local_30;
      local_30 = (long *)((long)local_30 + local_38);
      local_4c = 0;
      piVar4 = (int *)CNscContext::GetSymbolData
                                (in_stack_ffffffffffffff20,
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_58 = (long *)(piVar4 + 0xc);
      for (local_64 = *piVar4; uVar6 = 0 < local_64 && local_40 < local_30,
          0 < local_64 && local_40 < local_30; local_64 = local_64 + -1) {
        local_4c = local_4c + 1;
        if ((int)local_40[1] != 2) {
          __assert_fail("p1 ->nOpCode == NscPCode_Argument",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1216,
                        "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
        }
        if ((int)local_58[1] != 1) {
          __assert_fail("p2 ->nOpCode == NscPCode_Declaration",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1217,
                        "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
        }
        if ((*(int *)((long)local_40 + 0xc) == 2) || (*(int *)((long)local_58 + 0xc) == 2)) {
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          break;
        }
        if (*(int *)((long)local_40 + 0xc) != *(int *)((long)local_58 + 0xc)) {
          local_79 = true;
          if (((*(int *)((long)local_58 + 0xc) == 3) && (*(int *)((long)local_40 + 0xc) == 1)) &&
             (0x2f < (ulong)local_40[2])) {
            in_stack_ffffffffffffff56 = true;
            if ((int)((long *)((long)local_40 + local_40[3]))[1] == 4) {
              in_stack_ffffffffffffff56 = *(long *)((long)local_40 + local_40[3]) != local_40[2];
            }
            local_79 = (bool)in_stack_ffffffffffffff56;
            if ((bool)in_stack_ffffffffffffff56 == false) {
              *(undefined4 *)((long)local_40 + 0xc) = 3;
            }
          }
          if (local_79 != false) {
            in_stack_ffffffffffffff48 = g_pCtx;
            pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
            in_stack_ffffffffffffff18 = *(undefined4 *)((long)local_40 + 0xc);
            CNscContext::GenerateMessage
                      (in_stack_ffffffffffffff48,NscMessage_ErrorFunctionArgTypeMismatch,pcVar3,
                       (long)local_58 + 0x3c,(ulong)local_4c,(ulong)*(uint *)((long)local_58 + 0xc))
            ;
            CNscPStackEntry::SetType
                      ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            break;
          }
        }
        local_40 = (long *)(*local_40 + (long)local_40);
        local_58 = (long *)(*local_58 + (long)local_58);
      }
      NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)this);
      pCVar5 = g_pCtx;
      if (NVar2 != NscType_Error) {
        if (local_40 < local_30) {
          pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
          CNscContext::GenerateMessage(pCVar5,NscMessage_ErrorTooManyFunctionArgs,pcVar3);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        }
        else {
          for (; 0 < local_64; local_64 = local_64 + -1) {
            if ((int)local_58[1] != 1) {
              __assert_fail("p2 ->nOpCode == NscPCode_Declaration",
                            "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                            ,0x127f,
                            "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
            }
            if (*(int *)((long)local_58 + 0xc) == 2) {
              CNscPStackEntry::SetType
                        ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
              break;
            }
            if (local_58[3] == 0) {
              in_stack_ffffffffffffff38 = (long)local_58 + 0x3c;
              pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
              CNscContext::GenerateMessage
                        (pCVar5,NscMessage_ErrorRequiredFunctionArgMissing,in_stack_ffffffffffffff38
                         ,pcVar3);
              CNscPStackEntry::SetType
                        ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
              break;
            }
            local_58 = (long *)(*local_58 + (long)local_58);
          }
          if (local_64 < 1) {
            in_stack_ffffffffffffff20 = this;
            CNscContext::GetSymbolOffset
                      (this,(NscSymbol *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            CNscPStackEntry::PushCall
                      (in_stack_ffffffffffffff60,nType,
                       CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50))
                       ,(size_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38);
            CNscPStackEntry::SetType
                      ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          }
          NscParserReferenceSymbol(pSymbol_00);
        }
      }
    }
    else {
      pCVar5 = g_pCtx;
      pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
      CNscContext::GenerateMessage(pCVar5,NscMessage_ErrorCantInvokeIdentAsFunction,pcVar3);
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffff20,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (in_RSI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffff20,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
  }
  else {
    if (in_RDI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffff20,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    if (in_RSI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffff20,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c)
    ;
  }
  return (CNscPStackEntry *)this;
}

Assistant:

YYSTYPE NscBuildCall (YYSTYPE pFn, YYSTYPE pArgList)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	
	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pFn)
			g_pCtx ->FreePStackEntry (pFn);
		if (pArgList)
			g_pCtx ->FreePStackEntry (pArgList);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Search for the function in the symbol table
	//

	assert (pFn);
	NscSymbol *pSymbol = g_pCtx ->FindDeclSymbol (
		pFn ->GetIdentifier ());
	
	//
	// If the identifier wasn't found
	//

	if (pSymbol == NULL)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorUndeclaredIdentifier,
			pFn ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// If this is not a function
	//

	else if (pSymbol ->nSymType != NscSymType_Function)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorCantInvokeIdentAsFunction,
			pFn ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we have a good symbol
	//

	else
	{

		//
		// Get a pointer to the arguments
		//

		unsigned char *pauchStartData = NULL;
		size_t nDataSize = 0;
		if (pArgList)
		{
			pauchStartData = pArgList ->GetData ();
			nDataSize = pArgList ->GetDataSize ();
		}
		unsigned char *pauchData = pauchStartData;
		unsigned char *pauchEnd = &pauchData [nDataSize];

		//
		// Count the number of arguments while we make sure 
		// we don't have any type mismatches
		//

		int nArgCount = 0;
		unsigned char *pauchFnData = g_pCtx ->GetSymbolData (pSymbol ->nExtra);
		NscSymbolFunctionExtra *pfnExtra = (NscSymbolFunctionExtra *) pauchFnData;
		int nFnArgCount = pfnExtra ->nArgCount;
		pauchFnData += sizeof (NscSymbolFunctionExtra);
		while (nFnArgCount > 0 && pauchData < pauchEnd)
		{

			//
			// Get the next pair.  Arguments from the call 
			// and declarations from the prototype.
			//

			nArgCount++;
			NscPCodeArgument *p1 = (NscPCodeArgument *) pauchData;
			NscPCodeDeclaration *p2 = (NscPCodeDeclaration *) pauchFnData;
			assert (p1 ->nOpCode == NscPCode_Argument);
			assert (p2 ->nOpCode == NscPCode_Declaration);

			//
			// Check for soft errors
			//

			if (p1 ->nType == NscType_Error ||
				p2 ->nType == NscType_Error)
			{
				pOut ->SetType (NscType_Error);
				break;
			}

			//
			// Check for mismatch
			//

			if (p1 ->nType != p2 ->nType)
			{

				//
				// If the declaration type is action and the
				// argument is a void with just a call, then
				// this is really a match.
				//
				// ALSO, mutate the type of the argument
				// to an ACTION.
				//

				bool fIsBad = true;
				if (p2 ->nType == NscType_Action &&
					p1 ->nType == NscType_Void &&
					p1 ->nDataSize >= sizeof (NscPCodeCall))
				{
					NscPCodeCall *pc = (NscPCodeCall *)
						&pauchData [p1 ->nDataOffset];
					fIsBad = pc ->nOpCode != NscPCode_Call ||
						pc ->nOpSize != p1 ->nDataSize;
					if (!fIsBad)
					{
						p1 ->nType = NscType_Action;
					}
				}

				//
				// If really bad
				//

				if (fIsBad)
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorFunctionArgTypeMismatch,
						pFn ->GetIdentifier (), p2 ->szString, nArgCount,
						p2 ->nType, p1 ->nType);
					pOut ->SetType (NscType_Error);
					break;
				}
			}

			//
			// Move onto the next argument
			//

			pauchData += p1 ->nOpSize;
			pauchFnData += p2 ->nOpSize;
			nFnArgCount--;
		}

		//
		// If there wasn't an error
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Make sure we don't have extra arguments
			//

			if (pauchData < pauchEnd)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTooManyFunctionArgs,
					pFn ->GetIdentifier ());
				pOut ->SetType (NscType_Error);
			}

			//
			// Otherwise
			//

			else 
			{

				//
				// Check to make sure all the remaining arguments are optional
				//

				while (nFnArgCount > 0)
				{

					//
					// Get declaration information
					//

					NscPCodeDeclaration *p2 = (NscPCodeDeclaration *) pauchFnData;
					assert (p2 ->nOpCode == NscPCode_Declaration);

					//
					// Check for soft errors
					//

					if (p2 ->nType == NscType_Error)
					{
						pOut ->SetType (NscType_Error);
						break;
					}

					//
					// Make sure it is optional
					//

					if (p2 ->nDataSize == 0)
					{
						g_pCtx ->GenerateMessage (NscMessage_ErrorRequiredFunctionArgMissing,
							p2 ->szString,
							pFn ->GetIdentifier ());
						pOut ->SetType (NscType_Error);
						break;
					}

					//
					// Move to the next function argument
					//

					pauchFnData += p2 ->nOpSize;
					nFnArgCount--;
				}

				//
				// If all were optional, add the call
				//

				if (nFnArgCount <= 0)
				{
					pOut ->PushCall (pSymbol ->nType, 
						g_pCtx ->GetSymbolOffset (pSymbol), 
						nArgCount, pauchStartData, nDataSize);
					pOut ->SetType (pSymbol ->nType);
				}

				//
				// Mark the function as called so that we do not allow the
				// prototype return value to be relaxed later on
				//

				NscParserReferenceSymbol (pSymbol);
			}
		}
	}

	//
	// Rundown
	//

	g_pCtx ->FreePStackEntry (pFn);
	if (pArgList)
		g_pCtx ->FreePStackEntry (pArgList);
	return pOut;
}